

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# si_function.hpp
# Opt level: O3

double __thiscall
sisl::si_function<sisl::cartesian_cubic<float>,_sisl::tp_linear,_3>::d
          (si_function<sisl::cartesian_cubic<float>,_sisl::tp_linear,_3> *this,int component,
          double d0,...)

{
  char in_AL;
  undefined8 *puVar1;
  undefined8 in_RCX;
  uint uVar2;
  undefined8 in_RDX;
  long lVar3;
  double *pdVar4;
  ulong uVar5;
  double *pdVar6;
  undefined8 in_R8;
  undefined8 in_R9;
  double extraout_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list vl;
  double *local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  double *local_e0;
  double *local_d8;
  double local_c8 [4];
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  if (in_AL != '\0') {
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  local_c8[2] = (double)in_RDX;
  local_c8[3] = (double)in_RCX;
  local_a8 = in_R8;
  local_a0 = in_R9;
  local_f8 = (double *)malloc(0x18);
  if (((ulong)local_f8 & 0xf) == 0) {
    if (local_f8 == (double *)0x0) {
      puVar1 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar1 = operator_delete;
      __cxa_throw(puVar1,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    local_f0 = 3;
    *local_f8 = d0;
    local_e8 = 0x4000000010;
    local_d8 = local_c8;
    pdVar4 = (double *)&stack0x00000008;
    local_e8._4_4_ = 0x40;
    lVar3 = 0;
    uVar2 = local_e8._4_4_;
    local_e0 = pdVar4;
    while( true ) {
      if (uVar2 < 0xa1) {
        uVar5 = (ulong)uVar2;
        uVar2 = uVar2 + 0x10;
        local_e8 = CONCAT44(uVar2,(undefined4)local_e8);
        pdVar6 = (double *)((long)local_d8 + uVar5);
      }
      else {
        local_e0 = pdVar4 + 1;
        pdVar6 = pdVar4;
        pdVar4 = local_e0;
      }
      if (lVar3 == 2) break;
      local_f8[lVar3 + 1] = *pdVar6;
      lVar3 = lVar3 + 1;
      if (lVar3 == 2) {
        (*(this->super_function)._vptr_function[7])(this,component,&local_f8);
        free(local_f8);
        return extraout_XMM0_Qa;
      }
    }
    __assert_fail("index >= 0 && index < size()",
                  "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x19a,
                  "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator[](Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                 );
  }
  __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                ,"/usr/include/eigen3/Eigen/src/Core/util/Memory.h",0xb9,
                "void *Eigen::internal::aligned_malloc(std::size_t)");
}

Assistant:

virtual const double d(int component, double d0, ...) const {
            va_list vl;
            vector V(N);
            V[0] = d0;

            va_start(vl, d0);
            for(unsigned int i = 1; i < N; i++) {
                V[i] = va_arg(vl, double);
            }
            va_end(vl);

            return d(component, V);
        }